

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O2

IterateResult __thiscall dit::FuzzyComparisonMetricCase::iterate(FuzzyComparisonMetricCase *this)

{
  Archive *pAVar1;
  TestLog *pTVar2;
  bool bVar3;
  bool bVar4;
  deUint64 dVar5;
  deUint64 dVar6;
  LogNumber<float> *access;
  ConstPixelBufferAccess *pCVar7;
  string *psVar8;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  char *description;
  int iVar9;
  float value;
  allocator<char> local_460;
  allocator<char> local_45f;
  allocator<char> local_45e;
  allocator<char> local_45d;
  allocator<char> local_45c;
  allocator<char> local_45b;
  allocator<char> local_45a;
  allocator<char> local_459;
  allocator<char> local_458;
  allocator<char> local_457;
  allocator<char> local_456;
  allocator<char> local_455;
  FuzzyCompareParams local_454;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  TextureLevel refImg;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  ConstPixelBufferAccess local_2d8;
  ConstPixelBufferAccess local_2b0;
  TextureLevel errorMask;
  TextureLevel cmpImg;
  LogImage local_238;
  LogImage local_1a8;
  LogImage local_118;
  LogNumber<float> local_88;
  
  tcu::TextureLevel::TextureLevel(&refImg);
  tcu::TextureLevel::TextureLevel(&cmpImg);
  tcu::TextureLevel::TextureLevel(&errorMask);
  local_454.maxSampleSkip = 0;
  pAVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive;
  de::FilePath::FilePath((FilePath *)&local_118,"internal/data/imagecompare");
  std::__cxx11::string::string((string *)&local_1a8,(string *)&this->m_refImg);
  de::FilePath::join((FilePath *)&local_238,(FilePath *)&local_118,(FilePath *)&local_1a8);
  tcu::ImageIO::loadImage(&refImg,pAVar1,local_238.m_name._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_118);
  pAVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive;
  de::FilePath::FilePath((FilePath *)&local_118,"internal/data/imagecompare");
  std::__cxx11::string::string((string *)&local_1a8,(string *)&this->m_cmpImg);
  de::FilePath::join((FilePath *)&local_238,(FilePath *)&local_118,(FilePath *)&local_1a8);
  tcu::ImageIO::loadImage(&cmpImg,pAVar1,local_238.m_name._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_118);
  local_238.m_name._M_dataplus._M_p = (pointer)refImg.m_format;
  tcu::TextureLevel::setStorage
            (&errorMask,(TextureFormat *)&local_238,refImg.m_size.m_data[0],refImg.m_size.m_data[1],
             refImg.m_size.m_data[2]);
  dVar5 = deGetMicroseconds();
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)&local_238,&refImg);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)&local_118,&cmpImg);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_1a8,&errorMask);
  value = tcu::fuzzyCompare(&local_454,(ConstPixelBufferAccess *)&local_238,
                            (ConstPixelBufferAccess *)&local_118,(PixelBufferAccess *)&local_1a8);
  dVar6 = deGetMicroseconds();
  pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"RefImage",(allocator<char> *)&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"Reference Image",(allocator<char> *)&local_318);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)&local_88,&refImg);
  access = &local_88;
  tcu::LogImage::LogImage
            (&local_238,&local_3b0,&local_3d0,(ConstPixelBufferAccess *)access,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  iVar9 = (int)pTVar2;
  tcu::LogImage::write(&local_238,iVar9,__buf,(size_t)access);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"CmpImage",(allocator<char> *)&local_338);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"Compare Image",(allocator<char> *)&local_358);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_2b0,&cmpImg);
  pCVar7 = &local_2b0;
  tcu::LogImage::LogImage(&local_118,&local_3f0,&local_410,pCVar7,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_118,iVar9,__buf_00,(size_t)pCVar7);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"ErrorMask",&local_45f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"Error Mask",&local_460);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_2d8,&errorMask);
  pCVar7 = &local_2d8;
  tcu::LogImage::LogImage(&local_1a8,&local_430,&local_450,pCVar7,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_1a8,iVar9,__buf_01,(size_t)pCVar7);
  tcu::LogImage::~LogImage(&local_1a8);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_430);
  tcu::LogImage::~LogImage(&local_118);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  tcu::LogImage::~LogImage(&local_238);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Result",&local_45f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"Result metric",&local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"",&local_455);
  psVar8 = &local_3b0;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&local_118,(string *)&local_2b0,(string *)&local_2d8,psVar8,
             QP_KEY_TAG_NONE,value);
  iVar9 = (int)pTVar2;
  tcu::LogNumber<float>::write((LogNumber<float> *)&local_118,iVar9,__buf_02,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"MinBound",&local_456);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Minimum bound",&local_457);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"",&local_458);
  psVar8 = &local_410;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&local_1a8,&local_3d0,&local_3f0,psVar8,QP_KEY_TAG_NONE,
             this->m_minBound);
  tcu::LogNumber<float>::write((LogNumber<float> *)&local_1a8,iVar9,__buf_03,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"MaxBound",&local_459);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"Maximum bound",&local_45a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"",&local_45b);
  psVar8 = &local_2f8;
  tcu::LogNumber<float>::LogNumber
            (&local_88,&local_430,&local_450,psVar8,QP_KEY_TAG_NONE,this->m_maxBound);
  tcu::LogNumber<float>::write(&local_88,iVar9,__buf_04,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"CompareTime",&local_45c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"Comparison time",&local_45d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"us",&local_45e);
  psVar8 = &local_358;
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)&local_238,&local_318,&local_338,psVar8,QP_KEY_TAG_TIME,
             dVar6 - dVar5);
  tcu::LogNumber<long>::write((LogNumber<long> *)&local_238,iVar9,__buf_05,(size_t)psVar8);
  tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&local_238);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_318);
  tcu::LogNumber<float>::~LogNumber(&local_88);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_430);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&local_118);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b0);
  bVar3 = value < this->m_minBound;
  bVar4 = this->m_maxBound < value;
  description = "Pass";
  if (bVar3 || bVar4) {
    description = "Metric out of bounds";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(bVar3 || bVar4),description);
  tcu::TextureLevel::~TextureLevel(&errorMask);
  tcu::TextureLevel::~TextureLevel(&cmpImg);
  tcu::TextureLevel::~TextureLevel(&refImg);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		tcu::TextureLevel		refImg;
		tcu::TextureLevel		cmpImg;
		tcu::TextureLevel		errorMask;
		tcu::FuzzyCompareParams	params;
		float					result		= 0.0f;
		deUint64				compareTime	= 0;

		params.maxSampleSkip = 0;

		tcu::ImageIO::loadImage(refImg, m_testCtx.getArchive(), de::FilePath::join(BASE_DIR, m_refImg).getPath());
		tcu::ImageIO::loadImage(cmpImg, m_testCtx.getArchive(), de::FilePath::join(BASE_DIR, m_cmpImg).getPath());

		errorMask.setStorage(refImg.getFormat(), refImg.getWidth(), refImg.getHeight(), refImg.getDepth());

		{
			const deUint64 startTime = deGetMicroseconds();
			result = tcu::fuzzyCompare(params, refImg, cmpImg, errorMask);
			compareTime = deGetMicroseconds()-startTime;
		}

		m_testCtx.getLog() << TestLog::Image("RefImage",	"Reference Image",	refImg)
						   << TestLog::Image("CmpImage",	"Compare Image",	cmpImg)
						   << TestLog::Image("ErrorMask",	"Error Mask",		errorMask);

		m_testCtx.getLog() << TestLog::Float("Result", "Result metric", "", QP_KEY_TAG_NONE, result)
						   << TestLog::Float("MinBound", "Minimum bound", "", QP_KEY_TAG_NONE, m_minBound)
						   << TestLog::Float("MaxBound", "Maximum bound", "", QP_KEY_TAG_NONE, m_maxBound)
						   << TestLog::Integer("CompareTime", "Comparison time", "us", QP_KEY_TAG_TIME, compareTime);

		{
			const bool isOk = de::inRange(result, m_minBound, m_maxBound);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Metric out of bounds");
		}

		return STOP;
	}